

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.h
# Opt level: O0

HttpResponse<true> * __thiscall
uWS::HttpResponse<true>::writeStatus(HttpResponse<true> *this,string_view status)

{
  HttpResponseData<true> *pHVar1;
  const_pointer pvVar2;
  size_type sVar3;
  AsyncSocket<true> *in_RDI;
  HttpResponseData<true> *httpResponseData;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  pHVar1 = getHttpResponseData((HttpResponse<true> *)0x228f22);
  if ((pHVar1->state & 1U) == 0) {
    pHVar1->state = pHVar1->state | 1;
    AsyncSocket<true>::write(in_RDI,0x27df97,(void *)0x9,0);
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_18);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_18);
    AsyncSocket<true>::write(in_RDI,(int)pvVar2,(void *)(sVar3 & 0xffffffff),0);
    AsyncSocket<true>::write(in_RDI,0x27df83,(void *)0x2,0);
  }
  return (HttpResponse<true> *)in_RDI;
}

Assistant:

HttpResponse *writeStatus(std::string_view status) {
        HttpResponseData<SSL> *httpResponseData = getHttpResponseData();

        /* Do not allow writing more than one status */
        if (httpResponseData->state & HttpResponseData<SSL>::HTTP_STATUS_CALLED) {
            return this;
        }

        /* Update status */
        httpResponseData->state |= HttpResponseData<SSL>::HTTP_STATUS_CALLED;

        Super::write("HTTP/1.1 ", 9);
        Super::write(status.data(), (int) status.length());
        Super::write("\r\n", 2);
        return this;
    }